

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O1

float linalg::uangle<float,4>(vec<float,_4> *a,vec<float,_4> *b)

{
  float __x;
  float fVar1;
  
  fVar1 = a->x * b->x + 0.0 + a->y * b->y + a->z * b->z + a->w * b->w;
  if (1.0 < fVar1) {
    return 0.0;
  }
  __x = -1.0;
  if (-1.0 <= fVar1) {
    __x = fVar1;
  }
  fVar1 = acosf(__x);
  return fVar1;
}

Assistant:

constexpr auto operator() (A & a) const -> decltype(a.y) { return a.y; }